

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

bool cmState::IsCacheEntryType(string *key)

{
  __type _Var1;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL> *__rhs
  ;
  long lVar2;
  string *psVar3;
  
  __rhs = &cmCacheEntryTypes_abi_cxx11_;
  for (lVar2 = 0xe0; psVar3 = __rhs->_M_elems, lVar2 != 0x60; lVar2 = lVar2 + -0x80) {
    _Var1 = std::operator==(key,__rhs->_M_elems);
    if (_Var1) goto LAB_002705e2;
    psVar3 = (string *)((long)__rhs + 0x20);
    _Var1 = std::operator==(key,psVar3);
    if (_Var1) goto LAB_002705e2;
    psVar3 = (string *)((long)__rhs + 0x40);
    _Var1 = std::operator==(key,psVar3);
    if (_Var1) goto LAB_002705e2;
    psVar3 = (string *)((long)__rhs + 0x60);
    _Var1 = std::operator==(key,psVar3);
    if (_Var1) goto LAB_002705e2;
    __rhs = (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_7UL>
             *)((long)__rhs + 0x80);
  }
  _Var1 = std::operator==(key,__rhs->_M_elems);
  if (!_Var1) {
    psVar3 = (string *)((long)__rhs + 0x20);
    _Var1 = std::operator==(key,psVar3);
    if (!_Var1) {
      psVar3 = (string *)((long)__rhs + 0x40);
      _Var1 = std::operator==(key,psVar3);
      if (!_Var1) {
        psVar3 = &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
      }
    }
  }
LAB_002705e2:
  return psVar3 != &GetGlobalProperty(std::__cxx11::string_const&)::s_out_abi_cxx11_;
}

Assistant:

bool cmState::IsCacheEntryType(std::string const& key)
{
  return std::any_of(
    cmCacheEntryTypes.begin(), cmCacheEntryTypes.end(),
    [&key](std::string const& i) -> bool { return key == i; });
}